

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestOutputCoverage::Run(TestOutputCoverage *this)

{
  RunParams local_1538;
  undefined1 local_1520 [8];
  Results rs;
  string local_1500 [32];
  undefined1 local_14e0 [8];
  TestOutputCoverageInternal myTestA;
  allocator local_1489;
  string local_1488 [32];
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> local_1468;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> op;
  TestRegistry r;
  TestOutputCoverage *this_local;
  
  testinator::TestRegistry::TestRegistry((TestRegistry *)&op);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1488,"TAP",&local_1489);
  testinator::MakeOutputter((testinator *)&local_1468,(string *)local_1488,OF_NONE);
  std::__cxx11::string::~string(local_1488);
  std::allocator<char>::~allocator((allocator<char> *)&local_1489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1500,"A",
             (allocator *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  TestOutputCoverageInternal::TestOutputCoverageInternal
            ((TestOutputCoverageInternal *)local_14e0,(TestRegistry *)&op,(string *)local_1500);
  std::__cxx11::string::~string(local_1500);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1538.m_flags = 0;
  local_1538._4_4_ = 0;
  local_1538.m_numPropertyChecks = 0;
  local_1538.m_randomSeed = 0;
  testinator::RunParams::RunParams(&local_1538);
  testinator::TestRegistry::RunAllTests
            ((Results *)local_1520,(TestRegistry *)&op,&local_1538,(Outputter *)0x0);
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1520);
  TestOutputCoverageInternal::~TestOutputCoverageInternal((TestOutputCoverageInternal *)local_14e0);
  std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::~unique_ptr
            (&local_1468);
  testinator::TestRegistry::~TestRegistry((TestRegistry *)&op);
  return true;
}

Assistant:

DEF_TEST(OutputCoverage, Test)
{
  testinator::TestRegistry r;
  std::unique_ptr<testinator::Outputter> op =
    testinator::MakeOutputter("TAP", testinator::OF_NONE);
  TestOutputCoverageInternal myTestA(r, "A");
  testinator::Results rs = r.RunAllTests();
  return true;
}